

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_bulletproof_rangeproof_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,
              secp256k1_bulletproof_generators *gens,uchar *proof,size_t plen,uint64_t *min_value,
              secp256k1_pedersen_commitment *commit,size_t n_commits,size_t nbits,
              secp256k1_generator *value_gen,uchar *extra_commit,size_t extra_commit_len)

{
  int iVar1;
  secp256k1_ge *psVar2;
  void *pvVar3;
  char *pcVar4;
  secp256k1_ge *ge;
  size_t sVar5;
  bool bVar6;
  uchar *proof_local;
  uint64_t *minvalue_ptr;
  secp256k1_ge *commitp_ptr;
  secp256k1_ge value_genp;
  
  proof_local = proof;
  if (gens->n < n_commits * nbits * 2) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "gens->n >= 2 * nbits * n_commits";
  }
  else if (n_commits == 0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "n_commits > 0";
  }
  else if (nbits == 0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "nbits > 0";
  }
  else if (nbits < 0x41) {
    if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
      if ((ctx->ecmult_ctx).pre_g != (secp256k1_ge_storage_0_ *)0x0) {
        iVar1 = secp256k1_scratch_allocate_frame(scratch,n_commits * 0xb0,1);
        if (iVar1 == 0) {
          return 0;
        }
        psVar2 = (secp256k1_ge *)secp256k1_scratch_alloc(scratch,n_commits * 0x58);
        ge = psVar2;
        sVar5 = n_commits;
        while (bVar6 = sVar5 != 0, sVar5 = sVar5 - 1, bVar6) {
          secp256k1_pedersen_commitment_load(ge,commit);
          ge = ge + 1;
          commit = commit + 1;
        }
        secp256k1_generator_load(&value_genp,value_gen);
        minvalue_ptr = min_value;
        commitp_ptr = psVar2;
        iVar1 = secp256k1_bulletproof_rangeproof_verify_impl
                          (&ctx->ecmult_ctx,scratch,&proof_local,1,plen,nbits,&minvalue_ptr,
                           &commitp_ptr,n_commits,&value_genp,gens,&extra_commit,&extra_commit_len);
        secp256k1_scratch_deallocate_frame(scratch);
        return iVar1;
      }
      pvVar3 = (ctx->illegal_callback).data;
      pcVar4 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
    }
    else {
      pvVar3 = (ctx->illegal_callback).data;
      pcVar4 = "extra_commit != NULL || extra_commit_len == 0";
    }
  }
  else {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "nbits <= 64";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_bulletproof_rangeproof_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const secp256k1_bulletproof_generators *gens, const unsigned char *proof, size_t plen,
 const uint64_t *min_value, const secp256k1_pedersen_commitment* commit, size_t n_commits, size_t nbits, const secp256k1_generator *value_gen, const unsigned char *extra_commit, size_t extra_commit_len) {
    int ret;
    size_t i;
    secp256k1_ge *commitp;
    secp256k1_ge value_genp;
    const secp256k1_ge *commitp_ptr;
    const uint64_t *minvalue_ptr;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(gens != NULL);
    ARG_CHECK(gens->n >= 2 * nbits * n_commits);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(n_commits > 0);
    ARG_CHECK(nbits > 0);
    ARG_CHECK(nbits <= 64);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));

    if (!secp256k1_scratch_allocate_frame(scratch, 2 * n_commits * sizeof(secp256k1_ge), 1)) {
        return 0;
    }

    commitp = (secp256k1_ge *)secp256k1_scratch_alloc(scratch, n_commits * sizeof(secp256k1_ge));
    for (i = 0; i < n_commits; i++) {
        secp256k1_pedersen_commitment_load(&commitp[i], &commit[i]);
    }
    secp256k1_generator_load(&value_genp, value_gen);

    commitp_ptr = commitp;
    minvalue_ptr = min_value;
    ret = secp256k1_bulletproof_rangeproof_verify_impl(&ctx->ecmult_ctx, scratch, &proof, 1, plen, nbits, &minvalue_ptr, &commitp_ptr, n_commits, &value_genp, gens, &extra_commit, &extra_commit_len);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}